

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

string * __thiscall
spectest::ExpectedValueToString_abi_cxx11_
          (string *__return_storage_ptr__,spectest *this,ExpectedValue *ev)

{
  int iVar1;
  char *pcVar2;
  ExpectedValue *ev_00;
  char *format;
  int lane;
  int lane_00;
  string local_88;
  ExpectedValue local_68;
  
  if (*(int *)this + 4U < 2) {
    if (*(int *)(this + 0x24) == 2) {
      pcVar2 = wabt::Type::GetName((Type *)this);
      format = "%s:nan:arithmetic";
    }
    else {
      if (*(int *)(this + 0x24) != 1) goto LAB_00175f94;
      pcVar2 = wabt::Type::GetName((Type *)this);
      format = "%s:nan:canonical";
    }
    wabt::StringPrintf_abi_cxx11_(__return_storage_ptr__,format,pcVar2);
  }
  else {
    if (*(int *)this == -5) {
      iVar1 = LaneCountFromType((Type)*(Enum *)(this + 0x20));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"v128 ","");
      lane_00 = 0;
      do {
        GetLane(&local_68,(ExpectedValue *)this,lane_00);
        ExpectedValueToString_abi_cxx11_(&local_88,(spectest *)&local_68,ev_00);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        lane_00 = lane_00 + 1;
      } while (iVar1 != lane_00);
      return __return_storage_ptr__;
    }
LAB_00175f94:
    wabt::interp::TypedValueToString_abi_cxx11_(__return_storage_ptr__,(interp *)this,&ev->value);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ExpectedValueToString(const ExpectedValue& ev) {
  // Extend TypedValueToString to print expected nan values too.
  switch (ev.value.type) {
    case Type::F32:
    case Type::F64:
      switch (ev.nan[0]) {
        case ExpectedNan::None:
          return TypedValueToString(ev.value);

        case ExpectedNan::Arithmetic:
          return StringPrintf("%s:nan:arithmetic", ev.value.type.GetName());

        case ExpectedNan::Canonical:
          return StringPrintf("%s:nan:canonical", ev.value.type.GetName());
      }
      break;

    case Type::V128: {
      int lane_count = LaneCountFromType(ev.lane_type);
      std::string result = "v128 ";
      for (int lane = 0; lane < lane_count; ++lane) {
        result += ExpectedValueToString(GetLane(ev, lane));
      }
      return result;
    }

    default:
      break;
  }
  return TypedValueToString(ev.value);
}